

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strs.c
# Opt level: O2

int nni_asprintf(char **sp,char *fmt,...)

{
  char in_AL;
  int iVar1;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  int iVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  va_list ap;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  ap[0]._0_8_ = &stack0x00000008;
  local_58 = 0x3000000010;
  iVar2 = 0;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  ap[0].overflow_arg_area = local_108;
  iVar1 = vsnprintf((char *)0x0,0,fmt,&local_58);
  __s = (char *)nni_alloc((long)iVar1 + 1U);
  if (__s == (char *)0x0) {
    iVar2 = 2;
  }
  else {
    ap[0]._0_8_ = &stack0x00000008;
    local_58 = 0x3000000010;
    ap[0].overflow_arg_area = local_108;
    vsnprintf(__s,(long)iVar1 + 1U,fmt,&local_58);
    *sp = __s;
  }
  return iVar2;
}

Assistant:

int
nni_asprintf(char **sp, const char *fmt, ...)
{
	va_list ap;
	size_t  len;
	char *  s;

	va_start(ap, fmt);
	len = vsnprintf(NULL, 0, fmt, ap);
	va_end(ap);
	len++;

	if ((s = nni_alloc(len)) == NULL) {
		return (NNG_ENOMEM);
	}
	va_start(ap, fmt);
	(void) vsnprintf(s, len, fmt, ap);
	va_end(ap);
	*sp = s;
	return (0);
}